

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_shf_df_mipsel
               (CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t imm)

{
  fpr_t *pfVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  wr_t wx;
  float64 local_18;
  float64 fStack_10;
  
  lVar2 = (ulong)ws * 0x10 + 0x228;
  if (df == 0) {
    bVar4 = 0;
    lVar3 = 0;
    do {
      *(undefined1 *)((long)&local_18 + lVar3) =
           *(undefined1 *)
            ((long)(env->active_fpu).fpr +
            (ulong)(imm >> (bVar4 & 6) & 3 | (uint)lVar3 & 0xc) + lVar2 + -0x228);
      lVar3 = lVar3 + 1;
      bVar4 = bVar4 + 2;
    } while (lVar3 != 0x10);
  }
  else if (df == 1) {
    bVar4 = 0;
    lVar3 = 0;
    do {
      *(undefined2 *)((long)&local_18 + lVar3 * 2) =
           *(undefined2 *)
            ((long)(env->active_fpu).fpr +
            (ulong)(imm >> (bVar4 & 6) & 3 | (uint)lVar3 & 4) * 2 + lVar2 + -0x228);
      lVar3 = lVar3 + 1;
      bVar4 = bVar4 + 2;
    } while (lVar3 != 8);
  }
  else {
    if (df != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1136,
                    "void helper_msa_shf_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    lVar3 = 0;
    do {
      *(undefined4 *)((long)&local_18 + lVar3 * 2) =
           *(undefined4 *)
            ((long)(env->active_fpu).fpr +
            (ulong)(imm >> ((byte)lVar3 & 0x1f) & 3) * 4 + lVar2 + -0x228);
      lVar3 = lVar3 + 2;
    } while (lVar3 != 8);
  }
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar1->fd = local_18;
  (&pfVar1->fd)[1] = fStack_10;
  return;
}

Assistant:

void helper_msa_shf_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       uint32_t ws, uint32_t imm)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t wx, *pwx = &wx;
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwx->b[i] = pws->b[SHF_POS(i, imm)];
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwx->h[i] = pws->h[SHF_POS(i, imm)];
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwx->w[i] = pws->w[SHF_POS(i, imm)];
        }
        break;
    default:
        assert(0);
    }
    msa_move_v(pwd, pwx);
}